

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobject.c
# Opt level: O2

void fiobj_free_complex_object(FIOBJ o)

{
  fiobj_object_vtable_s *pfVar1;
  fiobj_stack_s stack;
  fiobj_stack_s local_38;
  
  local_38.capa = 0;
  local_38.arry = (FIOBJ *)0x0;
  local_38.start = 0;
  local_38.end = 0;
  while( true ) {
    pfVar1 = fiobj_type_vtable(o);
    (*pfVar1->dealloc)(o,fiobj_dealloc_task,&local_38);
    if (local_38.end == local_38.start) break;
    o = local_38.arry[local_38.end - 1];
    local_38.end = local_38.end - 1;
  }
  fiobj_stack_free(&local_38);
  return;
}

Assistant:

void fiobj_free_complex_object(FIOBJ o) {
  fiobj_stack_s stack = FIO_ARY_INIT;
  do {
    FIOBJECT2VTBL(o)->dealloc(o, fiobj_dealloc_task, &stack);
  } while (!fiobj_stack_pop(&stack, &o));
  fiobj_stack_free(&stack);
}